

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O0

PmError Pm_Abort(PortMidiStream *stream)

{
  PmError local_1c;
  PmError err;
  PmInternal *midi;
  PortMidiStream *stream_local;
  
  if (stream == (PortMidiStream *)0x0) {
    local_1c = pmBadPtr;
  }
  else if (descriptors[*stream].pub.output == 0) {
    local_1c = pmBadPtr;
  }
  else if (descriptors[*stream].pub.opened == 0) {
    local_1c = pmBadPtr;
  }
  else {
    local_1c = (**(code **)(*(long *)((long)stream + 0x50) + 0x40))(stream);
  }
  if (local_1c == pmHostError) {
    (**(code **)(*(long *)((long)stream + 0x50) + 0x60))(stream,pm_hosterror_text,0x100);
    pm_hosterror = 1;
  }
  return local_1c;
}

Assistant:

PMEXPORT PmError Pm_Abort( PortMidiStream* stream ) {
    PmInternal *midi = (PmInternal *) stream;
    PmError err;
    /* arg checking */
    if (midi == NULL)
        err = pmBadPtr;
    else if (!descriptors[midi->device_id].pub.output)
        err = pmBadPtr;
    else if (!descriptors[midi->device_id].pub.opened)
        err = pmBadPtr;
    else
        err = (*midi->dictionary->abort)(midi);

    if (err == pmHostError) {
        midi->dictionary->host_error(midi, pm_hosterror_text, 
                                     PM_HOST_ERROR_MSG_LEN);
        pm_hosterror = TRUE;
    }
    return pm_errmsg(err);
}